

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SstReader::BP5PerformGets(SstReader *this)

{
  void **ppvVar1;
  SstReader *pSVar2;
  SstStatusValue SVar3;
  void *DP_TimestepInfo;
  ReadRequest *Req;
  pointer pRVar4;
  pointer ppvVar5;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  SstReader *local_f8;
  pointer local_f0;
  vector<void_*,_std::allocator<void_*>_> sstReadHandlers;
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  ReadRequests;
  void *ret;
  size_t maxReadSize;
  string local_90;
  string local_70;
  string local_50;
  
  adios2::format::BP5Deserializer::GenerateReadRequests
            (&ReadRequests,this->m_BP5Deserializer,true,&maxReadSize);
  sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pRVar4 = ReadRequests.
                super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 != ReadRequests.
                super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                ._M_impl.super__Vector_impl_data._M_finish; pRVar4 = pRVar4 + 1) {
    ppvVar1 = this->m_CurrentStepMetaData->DP_TimestepInfo;
    if (ppvVar1 == (void **)0x0) {
      DP_TimestepInfo = (void *)0x0;
    }
    else {
      DP_TimestepInfo = ppvVar1[pRVar4->WriterRank];
    }
    ret = SstReadRemoteMemory(this->m_Input,(int)pRVar4->WriterRank,pRVar4->Timestep,
                              pRVar4->StartOffset,pRVar4->ReadLength,pRVar4->DestinationAddr,
                              DP_TimestepInfo);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&sstReadHandlers,&ret);
  }
  local_f0 = sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_f8 = this;
  for (ppvVar5 = sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start; pSVar2 = local_f8, ppvVar5 != local_f0;
      ppvVar5 = ppvVar5 + 1) {
    SVar3 = SstWaitForCompletion(local_f8->m_Input,*ppvVar5);
    if (SVar3 != SstSuccess) {
      std::__cxx11::string::string((string *)&ret,"Engine",&local_f9);
      std::__cxx11::string::string((string *)&local_50,"SstReader",&local_fa);
      std::__cxx11::string::string((string *)&local_70,"BP5PerformGets",&local_fb);
      std::__cxx11::string::string
                ((string *)&local_90,"Writer failed before returning data",&local_fc);
      helper::Throw<std::runtime_error>((string *)&ret,&local_50,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&ret);
    }
  }
  adios2::format::BP5Deserializer::FinalizeGets(local_f8->m_BP5Deserializer,&ReadRequests);
  adios2::format::BP5Deserializer::ClearGetState(pSVar2->m_BP5Deserializer);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&sstReadHandlers.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::
  _Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  ::~_Vector_base(&ReadRequests.
                   super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                 );
  return;
}

Assistant:

void SstReader::BP5PerformGets()
{
    size_t maxReadSize;
    auto ReadRequests = m_BP5Deserializer->GenerateReadRequests(true, &maxReadSize);
    std::vector<void *> sstReadHandlers;
    for (const auto &Req : ReadRequests)
    {
        void *dp_info = NULL;
        if (m_CurrentStepMetaData->DP_TimestepInfo)
        {
            dp_info = m_CurrentStepMetaData->DP_TimestepInfo[Req.WriterRank];
        }
        auto ret = SstReadRemoteMemory(m_Input, (int)Req.WriterRank, Req.Timestep, Req.StartOffset,
                                       Req.ReadLength, Req.DestinationAddr, dp_info);
        sstReadHandlers.push_back(ret);
    }
    for (const auto &i : sstReadHandlers)
    {
        if (SstWaitForCompletion(m_Input, i) != SstSuccess)
        {
            helper::Throw<std::runtime_error>("Engine", "SstReader", "BP5PerformGets",
                                              "Writer failed before returning data");
        }
    }

    m_BP5Deserializer->FinalizeGets(ReadRequests);
    m_BP5Deserializer->ClearGetState();
}